

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

ARTConflictType
duckdb::Prefix::Insert
          (ART *art,Node *node,ARTKey *key,idx_t depth,ARTKey *row_id,GateStatus status,
          optional_ptr<duckdb::ART,_true> delete_art,IndexAppendMode append_mode)

{
  uint8_t byte;
  reference<Node> rVar1;
  GateStatus GVar2;
  ARTConflictType AVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined7 in_register_00000089;
  reference<Node> next;
  idx_t depth_local;
  undefined4 local_6c;
  reference<Node> ref;
  Node remainder;
  optional_idx pos;
  Node leaf;
  
  next._M_data = node;
  depth_local = depth;
  pos = TraverseInternal<duckdb::Node>(art,&next,key,&depth_local,true);
  rVar1._M_data = next._M_data;
  if (pos.index == 0xffffffffffffffff) {
    AVar3 = ART::Insert(art,next._M_data,key,depth_local,row_id,status,delete_art,append_mode);
    return AVar3;
  }
  local_6c = (undefined4)CONCAT71(in_register_00000089,status);
  remainder.super_IndexPointer.data = (IndexPointer)0;
  iVar4 = optional_idx::GetIndex(&pos);
  Prefix((Prefix *)&leaf,art,(Node)((rVar1._M_data)->super_IndexPointer).data,false,false);
  byte = *(uint8_t *)((long)leaf.super_IndexPointer.data + (iVar4 & 0xff));
  iVar4 = optional_idx::GetIndex(&pos);
  GVar2 = Split(art,&next,&remainder,(uint8_t)iVar4);
  BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(art,next._M_data);
  if (GVar2 == GATE_NOT_SET) {
    uVar5 = ((next._M_data)->super_IndexPointer).data & 0x7fffffffffffffff;
  }
  else {
    if (GVar2 != GATE_SET) goto LAB_00c27fa8;
    uVar5 = ((next._M_data)->super_IndexPointer).data | 0x8000000000000000;
  }
  ((next._M_data)->super_IndexPointer).data = uVar5;
LAB_00c27fa8:
  Node4::InsertChild(art,next._M_data,byte,remainder);
  if ((char)local_6c == '\x01') {
    uVar5 = *(ulong *)key->data;
    uVar6 = uVar5 & 0xfffffffffffffff8 ^ 0x87;
    Node::InsertChild(art,next._M_data,*(uint8_t *)((long)key->data + depth_local),
                      (Node)(uVar5 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                             (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                             (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                             (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38));
  }
  else {
    leaf.super_IndexPointer.data = (IndexPointer)0;
    ref._M_data = &leaf;
    if (depth_local + 1 < key->len) {
      New(art,&ref,key,depth_local + 1,key->len + ~depth_local);
    }
    uVar5 = *(ulong *)row_id->data & 0xfffffffffffffff8 ^ 0x87;
    ((ref._M_data)->super_IndexPointer).data =
         *(ulong *)row_id->data >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
         (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8
         | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    Node4::InsertChild(art,next._M_data,key->data[depth_local],leaf);
  }
  return NO_CONFLICT;
}

Assistant:

ARTConflictType Prefix::Insert(ART &art, Node &node, const ARTKey &key, idx_t depth, const ARTKey &row_id,
                               const GateStatus status, optional_ptr<ART> delete_art,
                               const IndexAppendMode append_mode) {
	reference<Node> next(node);
	auto pos = TraverseMutable(art, next, key, depth);

	// We recurse into the next node, if
	// (1) the prefix matches the key.
	// (2) we reach a gate.
	if (!pos.IsValid()) {
		D_ASSERT(next.get().GetType() != NType::PREFIX || next.get().GetGateStatus() == GateStatus::GATE_SET);
		return art.Insert(next, key, depth, row_id, status, delete_art, append_mode);
	}

	Node remainder;
	auto byte = GetByte(art, next, UnsafeNumericCast<uint8_t>(pos.GetIndex()));
	auto split_status = Split(art, next, remainder, UnsafeNumericCast<uint8_t>(pos.GetIndex()));
	Node4::New(art, next);
	next.get().SetGateStatus(split_status);

	// Insert the remaining prefix into the new Node4.
	Node4::InsertChild(art, next, byte, remainder);

	if (status == GateStatus::GATE_SET) {
		D_ASSERT(pos.GetIndex() != ROW_ID_COUNT);
		Node new_row_id;
		Leaf::New(new_row_id, key.GetRowId());
		Node::InsertChild(art, next, key[depth], new_row_id);
		return ARTConflictType::NO_CONFLICT;
	}

	Node leaf;
	reference<Node> ref(leaf);
	if (depth + 1 < key.len) {
		// Create the prefix.
		auto count = key.len - depth - 1;
		Prefix::New(art, ref, key, depth + 1, count);
	}

	// Create the inlined leaf.
	Leaf::New(ref, row_id.GetRowId());
	Node4::InsertChild(art, next, key[depth], leaf);
	return ARTConflictType::NO_CONFLICT;
}